

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

FilePath * __thiscall
testing::internal::FilePath::RemoveFileName(FilePath *__return_storage_ptr__,FilePath *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  char *pcVar2;
  string dir;
  string local_60;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  __s = (this->pathname_)._M_dataplus._M_p;
  pcVar2 = strrchr(__s,0x2f);
  paVar1 = &local_60.field_2;
  local_60._M_string_length = 0;
  local_60.field_2._M_local_buf[0] = '\0';
  local_60._M_dataplus._M_p = (pointer)paVar1;
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::_M_replace((ulong)&local_60,0,(char *)0x0,0x14d97d);
  }
  else {
    local_40[0] = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_40,__s,pcVar2 + 1);
    std::__cxx11::string::operator=((string *)&local_60,(string *)local_40);
    if (local_40[0] != local_30) {
      operator_delete(local_40[0]);
    }
  }
  FilePath(__return_storage_ptr__,&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

FilePath FilePath::RemoveFileName() const {
  const char* const last_sep = FindLastPathSeparator();
  std::string dir;
  if (last_sep) {
    dir = std::string(c_str(), last_sep + 1 - c_str());
  } else {
    dir = kCurrentDirectoryString;
  }
  return FilePath(dir);
}